

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::GenerateAbstractMethods
          (ImmutableServiceGenerator *this,Printer *printer)

{
  Context *pCVar1;
  pointer pcVar2;
  ServiceDescriptor *pSVar3;
  Options *in_RCX;
  long lVar4;
  long lVar5;
  Printer *printer_00;
  string_view text;
  undefined1 local_80 [8];
  DescriptorNames local_78;
  Descriptor *local_68 [2];
  Descriptor *local_58 [2];
  MethodOptions *local_48 [2];
  undefined2 local_38;
  
  pSVar3 = (this->super_ServiceGenerator).descriptor_;
  if (0 < pSVar3->method_count_) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      printer_00 = (Printer *)(&pSVar3->methods_->super_SymbolBase + lVar4);
      pCVar1 = this->context_;
      local_80[4] = (pCVar1->options_).opensource_runtime;
      local_80[5] = (pCVar1->options_).annotate_code;
      local_80[0] = (pCVar1->options_).generate_immutable_code;
      local_80[1] = (pCVar1->options_).generate_mutable_code;
      local_80[2] = (pCVar1->options_).generate_shared_code;
      local_80[3] = (pCVar1->options_).enforce_lite;
      local_78.payload_ = (char *)local_68;
      pcVar2 = (pCVar1->options_).annotation_list_file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar2,
                 pcVar2 + (pCVar1->options_).annotation_list_file._M_string_length);
      local_58[0] = (Descriptor *)local_48;
      pcVar2 = (pCVar1->options_).output_list_file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar2,
                 pcVar2 + (pCVar1->options_).output_list_file._M_string_length);
      local_38._0_1_ = (pCVar1->options_).strip_nonfunctional_codegen;
      local_38._1_1_ = (pCVar1->options_).jvm_dsl;
      WriteMethodDocComment((java *)printer,printer_00,(MethodDescriptor *)local_80,in_RCX);
      if (local_58[0] != (Descriptor *)local_48) {
        operator_delete(local_58[0],
                        (ulong)((long)&(local_48[0]->super_Message).super_MessageLite.
                                       _vptr_MessageLite + 1));
      }
      if ((Descriptor **)local_78.payload_ != local_68) {
        operator_delete(local_78.payload_,(ulong)&local_68[0]->field_0x1);
      }
      GenerateMethodSignature(this,printer,(MethodDescriptor *)printer_00,IS_ABSTRACT);
      text._M_str = ";\n\n";
      text._M_len = 3;
      io::Printer::Print<>(printer,text);
      lVar5 = lVar5 + 1;
      pSVar3 = (this->super_ServiceGenerator).descriptor_;
      in_RCX = (Options *)(long)pSVar3->method_count_;
      lVar4 = lVar4 + 0x50;
    } while (lVar5 < (long)in_RCX);
  }
  return;
}

Assistant:

void ImmutableServiceGenerator::GenerateAbstractMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    WriteMethodDocComment(printer, method, context_->options());
    GenerateMethodSignature(printer, method, IS_ABSTRACT);
    printer->Print(";\n\n");
  }
}